

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

Allocation __thiscall
density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
external_allocate<0ul>
          (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
           *this,size_t i_size,size_t i_alignment)

{
  void *pvVar1;
  Allocation AVar4;
  Allocation inplace_put;
  void *external_block;
  size_t i_alignment_local;
  size_t i_size_local;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  ControlBlock *pCVar2;
  undefined8 *puVar3;
  
  pvVar1 = density_tests::UnmovableFastTestAllocator<65536UL>::allocate
                     ((UnmovableFastTestAllocator<65536UL> *)this,i_size,i_alignment,0);
  AVar4 = inplace_allocate<0ul,true>(this,0x18,8);
  puVar3 = (undefined8 *)AVar4.m_user_storage;
  pCVar2 = AVar4.m_control_block;
  *puVar3 = pvVar1;
  puVar3[1] = i_size;
  puVar3[2] = i_alignment;
  if ((pCVar2->m_next & 4) != 0) {
    density_tests::detail::assert_failed<>
              ("(inplace_put.m_control_block->m_next & detail::Queue_External) == 0",
               anon_var_dwarf_12e55,0xb09);
  }
  pCVar2->m_next = pCVar2->m_next | 4;
  AVar4.m_user_storage = pvVar1;
  AVar4.m_control_block = pCVar2;
  return AVar4;
}

Assistant:

Allocation external_allocate(size_t i_size, size_t i_alignment)
        {
            auto const external_block = ALLOCATOR_TYPE::allocate(i_size, i_alignment);
            try
            {
                /* external blocks always allocate space for the type, because it would be complicated
                    for the consumers to handle both cases*/
                auto const inplace_put = inplace_allocate<CONTROL_BITS, true>(
                  sizeof(ExternalBlock), alignof(ExternalBlock));

                new (inplace_put.m_user_storage) ExternalBlock{external_block, i_size, i_alignment};

                DENSITY_ASSERT((inplace_put.m_control_block->m_next & detail::Queue_External) == 0);
                inplace_put.m_control_block->m_next |= detail::Queue_External;
                return Allocation{inplace_put.m_control_block, external_block};
            }
            catch (...)
            {
                /* if inplace_allocate fails, that means that we were able to allocate the external block,
                    but we were not able to put the struct ExternalBlock in the page (because a new page was
                    necessary, but we could not allocate it). */
                ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                throw;
            }
        }